

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O1

void __thiscall CGameClient::StartRendering(CGameClient *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  IGraphics *pIVar4;
  bool bVar5;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = this->m_pConfig->m_GfxClear;
  bVar5 = CMenus::IsBackgroundNeeded(this->m_pMenus);
  if (iVar3 != 0) {
    if (bVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_001835d2;
      uVar6 = 0x3ee66666;
      uVar7 = 0x3ee66666;
      uVar9 = 0x3ee66666;
    }
    else {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_001835d2;
      uVar6 = 0x3f800000;
      uVar9 = 0;
      uVar7 = 0x3f800000;
    }
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[2])(uVar6,uVar7,uVar9);
    return;
  }
  if (bVar5) {
    pIVar4 = this->m_pGraphics;
    uVar1 = pIVar4->m_ScreenWidth;
    uVar2 = pIVar4->m_ScreenHeight;
    fVar8 = ((float)(int)uVar1 / (float)(int)uVar2) * 300.0;
    uVar10 = CONCAT44((float)(int)uVar2,fVar8);
    uVar11 = 0;
    local_38 = 0x3ee666663ee66666;
    uStack_30 = 0x3f8000003ee66666;
    local_48 = 0x3ee666663ee66666;
    uStack_40 = 0x3f8000003ee66666;
    (*(pIVar4->super_IInterface)._vptr_IInterface[5])(0,0,fVar8);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])(this->m_pGraphics,0xffffffff);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x22])
              (this->m_pGraphics,&local_48,&local_48,&local_38,&local_38,in_R9,uVar10,uVar11);
    local_58 = 0;
    local_50 = (undefined4)uVar10;
    local_4c = 0x43960000;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_58,1);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_001835d2:
  __stack_chk_fail();
}

Assistant:

void CGameClient::StartRendering()
{
	if(Config()->m_GfxClear)
	{
		if(m_pMenus->IsBackgroundNeeded())
			Graphics()->Clear(0.45f, 0.45f, 0.45f);
		else
			Graphics()->Clear(1.0f, 1.0f, 0.0f);
	}
	else if(m_pMenus->IsBackgroundNeeded())
	{
		// render background color
		const float ScreenHeight = 300.0f;
		const float ScreenWidth = ScreenHeight * Graphics()->ScreenAspect();
		const vec4 Bottom(0.45f, 0.45f, 0.45f, 1.0f);
		const vec4 Top(0.45f, 0.45f, 0.45f, 1.0f);
		Graphics()->MapScreen(0, 0, ScreenWidth, ScreenHeight);
		Graphics()->TextureClear();
		Graphics()->QuadsBegin();
		Graphics()->SetColor4(Top, Top, Bottom, Bottom);
		IGraphics::CQuadItem QuadItem(0, 0, ScreenWidth, ScreenHeight);
		Graphics()->QuadsDrawTL(&QuadItem, 1);
		Graphics()->QuadsEnd();
	}
}